

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

int __thiscall MlmWrap::processMlmNetworkNotification(MlmWrap *this,char *sender,TrodesMsg *msg)

{
  network_pimpl *pnVar1;
  bool bVar2;
  int iVar3;
  HFSubConsumer *pHVar4;
  HFSubWorker *pHVar5;
  const_iterator cVar6;
  long *plVar7;
  string origin;
  string noteType;
  string who;
  TrodesMsg m;
  string local_5b0;
  string local_590;
  undefined1 local_570 [144];
  HFSubSockSettings local_4e0;
  long *local_438 [2];
  long local_428 [2];
  long *local_418 [2];
  long local_408 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  string local_3d8;
  long *local_3b8 [2];
  long local_3a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  HighFreqDataType local_1d8;
  HighFreqDataType local_148;
  HighFreqDataType local_b8;
  
  TrodesMsg::popstr_abi_cxx11_(&local_590,msg);
  iVar3 = std::__cxx11::string::compare((char *)&local_590);
  if (iVar3 == 0) {
    HighFreqDataType::HighFreqDataType((HighFreqDataType *)local_570);
    binarydata::binarydata((binarydata *)&local_5b0);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"n","");
    TrodesMsg::popcontents<binarydata>(msg,&local_2b8,(binarydata *)&local_5b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    HighFreqDataType::decode((HighFreqDataType *)local_570,(binarydata *)&local_5b0);
    network_pimpl::insert_hfdt(this->state,(HighFreqDataType *)local_570);
    HighFreqDataType::getName_abi_cxx11_(&local_1f8,(HighFreqDataType *)local_570);
    HighFreqDataType::getOrigin_abi_cxx11_(&local_218,(HighFreqDataType *)local_570);
    bVar2 = isHfTypeCurrentlySubbed(this,&local_1f8,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      HighFreqDataType::getName_abi_cxx11_(&local_238,(HighFreqDataType *)local_570);
      HighFreqDataType::getOrigin_abi_cxx11_(&local_258,(HighFreqDataType *)local_570);
      getSubbedHFSockSettings(&local_4e0,this,&local_238,&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if (local_4e0.subSockType == ST_WORKER) {
        HighFreqDataType::HighFreqDataType(&local_148,(HighFreqDataType *)local_570);
        pHVar5 = createWorkerSub(this,&local_148,1,local_4e0.userFoo,local_4e0.args);
        HighFreqDataType::~HighFreqDataType(&local_148);
        (*(pHVar5->super_HighFreqSub)._vptr_HighFreqSub[2])(pHVar5);
      }
      else if (local_4e0.subSockType == ST_CONSUMER) {
        HighFreqDataType::HighFreqDataType(&local_b8,(HighFreqDataType *)local_570);
        pHVar4 = createConsumerSub(this,&local_b8,10);
        HighFreqDataType::~HighFreqDataType(&local_b8);
        (*(pHVar4->super_HighFreqSub)._vptr_HighFreqSub[2])(pHVar4);
      }
      HighFreqDataType::~HighFreqDataType(&local_4e0.dataType);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
    HighFreqDataType::~HighFreqDataType((HighFreqDataType *)local_570);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_590);
    if (iVar3 == 0) {
      HighFreqDataType::HighFreqDataType(&local_4e0.dataType);
      binarydata::binarydata((binarydata *)local_570);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"n","");
      TrodesMsg::popcontents<binarydata>(msg,&local_2d8,(binarydata *)local_570);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      HighFreqDataType::decode(&local_4e0.dataType,(binarydata *)local_570);
      network_pimpl::remove_hfdt(this->state,&local_4e0.dataType);
      HighFreqDataType::getName_abi_cxx11_(&local_278,&local_4e0.dataType);
      HighFreqDataType::getOrigin_abi_cxx11_(&local_298,&local_4e0.dataType);
      bVar2 = isHfTypeCurrentlySubbed(this,&local_278,&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      iVar3 = 0;
      if (bVar2) {
        HighFreqDataType::HighFreqDataType(&local_1d8,&local_4e0.dataType);
        iVar3 = removeSubFromList(this,&local_1d8);
        HighFreqDataType::~HighFreqDataType(&local_1d8);
      }
      if ((undefined1 *)local_570._0_8_ != local_570 + 0x10) {
        operator_delete((void *)local_570._0_8_,local_570._16_8_ + 1);
      }
      HighFreqDataType::~HighFreqDataType(&local_4e0.dataType);
      goto LAB_0018ae44;
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_590);
    if (iVar3 == 0) {
      TrodesMsg::popstr_abi_cxx11_((string *)local_570,msg);
      TrodesMsg::popstr_abi_cxx11_(&local_5b0,msg);
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f8,local_570._0_8_,(pointer)(local_570._8_8_ + local_570._0_8_));
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_318,local_5b0._M_dataplus._M_p,
                 local_5b0._M_dataplus._M_p + local_5b0._M_string_length);
      EventDataType::EventDataType((EventDataType *)&local_4e0,&local_2f8,&local_318);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      network_pimpl::insert_event(this->state,(EventDataType *)&local_4e0);
LAB_0018aa1b:
      local_4e0.dataType.super_NetworkDataType._vptr_NetworkDataType =
           (_func_int **)&PTR__EventDataType_002e7640;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0.dataType.origin._M_dataplus._M_p != &local_4e0.dataType.origin.field_2) {
        operator_delete(local_4e0.dataType.origin._M_dataplus._M_p,
                        local_4e0.dataType.origin.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0.dataType.name._M_dataplus._M_p != &local_4e0.dataType.name.field_2) {
        operator_delete(local_4e0.dataType.name._M_dataplus._M_p,
                        local_4e0.dataType.name.field_2._M_allocated_capacity + 1);
      }
      NetworkDataType::~NetworkDataType((NetworkDataType *)&local_4e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
        operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_590);
      if (iVar3 == 0) {
        TrodesMsg::popstr_abi_cxx11_((string *)local_570,msg);
        TrodesMsg::popstr_abi_cxx11_(&local_5b0,msg);
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_338,local_570._0_8_,(pointer)(local_570._8_8_ + local_570._0_8_)
                  );
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_358,local_5b0._M_dataplus._M_p,
                   local_5b0._M_dataplus._M_p + local_5b0._M_string_length);
        EventDataType::EventDataType((EventDataType *)&local_4e0,&local_338,&local_358);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        network_pimpl::remove_event(this->state,(EventDataType *)&local_4e0);
        goto LAB_0018aa1b;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_590);
      if (iVar3 == 0) {
        TrodesMsg::popstr_abi_cxx11_((string *)local_570,msg);
        iVar3 = std::__cxx11::string::compare(local_570);
        if ((iVar3 != 0) &&
           ((((pointer)local_570._8_8_ != (pointer)(this->id)._M_string_length ||
             (((pointer)local_570._8_8_ != (pointer)0x0 &&
              (iVar3 = bcmp((void *)local_570._0_8_,(this->id)._M_dataplus._M_p,local_570._8_8_),
              iVar3 != 0)))) && (iVar3 = std::__cxx11::string::compare(local_570), iVar3 != 0)))) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->state->clients,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_570)
          ;
        }
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"s","");
        local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_398,local_570._0_8_,(pointer)(local_570._8_8_ + local_570._0_8_)
                  );
        TrodesMsg::TrodesMsg<std::__cxx11::string>((TrodesMsg *)&local_4e0,&local_378,&local_398);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        local_3b8[0] = local_3a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3b8,local_590._M_dataplus._M_p,
                   local_590._M_dataplus._M_p + local_590._M_string_length);
        (*this->_vptr_MlmWrap[6])(this,sender,local_3b8,&local_4e0);
        plVar7 = local_3b8[0];
        if (local_3b8[0] != local_3a8) {
LAB_0018ae12:
          operator_delete(plVar7,local_3a8[0] + 1);
        }
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_590);
        if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)&local_590), iVar3 != 0))
        {
          local_438[0] = local_428;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_438,local_590._M_dataplus._M_p,
                     local_590._M_dataplus._M_p + local_590._M_string_length);
          iVar3 = (*this->_vptr_MlmWrap[6])(this,sender,local_438,msg);
          if (local_438[0] != local_428) {
            operator_delete(local_438[0],local_428[0] + 1);
          }
          goto LAB_0018ae44;
        }
        TrodesMsg::popstr_abi_cxx11_((string *)local_570,msg);
        iVar3 = std::__cxx11::string::compare(local_570);
        if ((((iVar3 != 0) &&
             (((pointer)local_570._8_8_ != (pointer)(this->id)._M_string_length ||
              (((pointer)local_570._8_8_ != (pointer)0x0 &&
               (iVar3 = bcmp((void *)local_570._0_8_,(this->id)._M_dataplus._M_p,local_570._8_8_),
               iVar3 != 0)))))) && (iVar3 = std::__cxx11::string::compare(local_570), iVar3 != 0))
           && (pnVar1 = this->state,
              cVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&(pnVar1->clients)._M_t,(key_type *)local_570),
              (_Rb_tree_header *)cVar6._M_node !=
              &(pnVar1->clients)._M_t._M_impl.super__Rb_tree_header)) {
          network_pimpl::remove_client(this->state,(string *)local_570);
        }
        local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"s","");
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3f8,local_570._0_8_,(pointer)(local_570._8_8_ + local_570._0_8_)
                  );
        TrodesMsg::TrodesMsg<std::__cxx11::string>((TrodesMsg *)&local_4e0,&local_3d8,&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
        }
        local_418[0] = local_408;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_418,local_590._M_dataplus._M_p,
                   local_590._M_dataplus._M_p + local_590._M_string_length);
        (*this->_vptr_MlmWrap[6])(this,sender,local_418,&local_4e0);
        local_3a8[0] = local_408[0];
        plVar7 = local_418[0];
        if (local_418[0] != local_408) goto LAB_0018ae12;
      }
      TrodesMsg::~TrodesMsg((TrodesMsg *)&local_4e0);
    }
    if ((undefined1 *)local_570._0_8_ != local_570 + 0x10) {
      operator_delete((void *)local_570._0_8_,local_570._16_8_ + 1);
    }
  }
  iVar3 = 0;
LAB_0018ae44:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  return iVar3;
}

Assistant:

int MlmWrap::processMlmNetworkNotification(const char *sender, TrodesMsg &msg) {
    int rc = 0;
    std::string noteType = msg.popstr();
    if (noteType == hfdt_register) { //High Frequency Data Type was registered by *sender
        HighFreqDataType registeredType;
        binarydata regdata;
        msg.popcontents("n", regdata);
        registeredType.decode(regdata);
        state->insert_hfdt(registeredType);

        if (isHfTypeCurrentlySubbed(registeredType.getName(), registeredType.getOrigin())) {
            //resub if the module had previously been subbed to this type and the user didn't unsub manually
            HFSubSockSettings sockInfo = getSubbedHFSockSettings(registeredType.getName(), registeredType.getOrigin());

            if (sockInfo.subSockType == HighFreqSub::ST_CONSUMER) {
                HFSubConsumer *sub = createConsumerSub(registeredType, 10);
                sub->initialize();
            }
            else if (sockInfo.subSockType == HighFreqSub::ST_WORKER) {
                HFSubWorker *sub = createWorkerSub(registeredType, 1, sockInfo.userFoo, sockInfo.args);
                sub->initialize();
            }
            //todo: add some way to save the buffer size information
        }
    }
    else if (noteType == hfdt_deregister) { //High Frequency Data Type was deregistered by *sender
        HighFreqDataType deregisteredType;
        binarydata regdata;
        msg.popcontents("n", regdata);
        deregisteredType.decode(regdata);
        state->remove_hfdt(deregisteredType);

        if (isHfTypeCurrentlySubbed(deregisteredType.getName(), deregisteredType.getOrigin())) {
            rc = removeSubFromList(deregisteredType);
        }
    }
    else if(noteType == eventprovide){
        std::string event = msg.popstr();
        std::string origin = msg.popstr();
        EventDataType ev(event, origin);
        state->insert_event(ev);
    }
    else if(noteType == eventunprovide){
        std::string name = msg.popstr();
        std::string origin = msg.popstr();
        EventDataType ev(name, origin);
        state->remove_event(ev);
    }
    else if(noteType == CLIENT_CONNECT_MSG){
        std::string who = msg.popstr();
        if(who != TEMP_NETWORK_ID && who != id && who != BROKER_NETWORK_ID){
            state->insert_client(who);
        }
        TrodesMsg m("s", who);
        processNotification(sender, noteType, m);
    }
    else if(noteType == CLIENT_DISCONNECT_MSG || noteType == CLIENT_EXPIRED_MSG){
        std::string who = msg.popstr();
        if(who != TEMP_NETWORK_ID && who != id && who != BROKER_NETWORK_ID && state->client_exists(who)){
            state->remove_client(who);
        }
       TrodesMsg m("s", who);
       processNotification(sender, noteType, m);
    }
    else {
        rc = processNotification(sender, noteType, msg);
    }
    return(rc);
}